

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFieldOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  MessageOptions *pMVar1;
  long lVar2;
  FileOptions *pFVar3;
  bool bVar4;
  MessageOptions *pMVar5;
  FileOptions *pFVar6;
  ErrorLocation location;
  string *element_name;
  char *error;
  
  if (this->pool_->lazily_build_dependencies_ == true) {
    if (field == (FieldDescriptor *)0x0) {
      return;
    }
    if (*(GoogleOnceDynamic **)(field + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(field + 0x40),FieldDescriptor::TypeOnceInit,field);
    }
    if (*(long *)(field + 0x70) == 0) {
      return;
    }
  }
  if (*(char *)(*(long *)(field + 0x80) + 0x6d) == '\x01') {
    if (*(GoogleOnceDynamic **)(field + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(field + 0x40),FieldDescriptor::TypeOnceInit,field);
    }
    if (*(int *)(field + 0x48) != 0xb) {
      AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }
  if (*(char *)(*(long *)(field + 0x80) + 0x6c) == '\x01') {
    if (*(int *)(field + 0x4c) == 3) {
      if (*(GoogleOnceDynamic **)(field + 0x40) != (GoogleOnceDynamic *)0x0) {
        GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                  (*(GoogleOnceDynamic **)(field + 0x40),FieldDescriptor::TypeOnceInit,field);
      }
      if (*(int *)(field + 0x48) - 0xdU < 0xfffffffc) goto LAB_002e837f;
    }
    AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
             "[packed = true] can only be specified for repeated primitive fields.");
  }
LAB_002e837f:
  if (((*(long *)(field + 0x58) != 0) &&
      (pMVar1 = *(MessageOptions **)(*(long *)(field + 0x58) + 0x20),
      pMVar5 = MessageOptions::default_instance(), pMVar1 != pMVar5)) &&
     (*(char *)(*(long *)(*(long *)(field + 0x58) + 0x20) + 0x68) == '\x01')) {
    if (field[0x50] == (FieldDescriptor)0x1) {
      if (*(int *)(field + 0x4c) == 1) {
        if (*(GoogleOnceDynamic **)(field + 0x40) != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                    (*(GoogleOnceDynamic **)(field + 0x40),FieldDescriptor::TypeOnceInit,field);
        }
        if (*(int *)(field + 0x48) == 0xb) goto LAB_002e8401;
      }
      element_name = *(string **)(field + 8);
      error = "Extensions of MessageSets must be optional messages.";
      location = TYPE;
    }
    else {
      element_name = *(string **)(field + 8);
      error = "MessageSets cannot have fields, only extensions.";
      location = NAME;
    }
    AddError(this,element_name,&proto->super_Message,location,error);
  }
LAB_002e8401:
  lVar2 = *(long *)(field + 0x30);
  if ((((lVar2 != 0) &&
       (pFVar3 = *(FileOptions **)(lVar2 + 0xa0), pFVar6 = FileOptions::default_instance(),
       pFVar3 != pFVar6)) &&
      ((*(int *)(*(long *)(lVar2 + 0xa0) + 0xa8) == 3 && (*(long *)(field + 0x58) != 0)))) &&
     (((lVar2 = *(long *)(*(long *)(field + 0x58) + 0x10), lVar2 == 0 ||
       (pFVar3 = *(FileOptions **)(lVar2 + 0xa0), pFVar6 = FileOptions::default_instance(),
       pFVar3 == pFVar6)) || (*(int *)(*(long *)(lVar2 + 0xa0) + 0xa8) != 3)))) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite files.  Note that you cannot extend a non-lite type to contain a lite type, but the reverse is allowed."
            );
  }
  bVar4 = FieldDescriptor::is_map(field);
  if ((bVar4) && (bVar4 = ValidateMapEntry(this,field,proto), !bVar4)) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,OTHER,
             "map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.");
    return;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFieldOptions(FieldDescriptor* field,
    const FieldDescriptorProto& proto) {
  if (pool_->lazily_build_dependencies_ && (!field || !field->message_type())) {
    return;
  }
  // Only message type fields may be lazy.
  if (field->options().lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
      field->full_name(), proto,
      DescriptorPool::ErrorCollector::TYPE,
      "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != NULL &&
      &field->containing_type()->options() !=
      &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if (!field->is_optional() ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) &&
      field->containing_type_ != NULL &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

  // Validate map types.
  if (field->is_map()) {
    if (!ValidateMapEntry(field, proto)) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "map_entry should not be set explicitly. Use map<KeyType, "
               "ValueType> instead.");
    }
  }

}